

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  void *pvVar7;
  int expand_mono;
  uchar *d;
  void *__s1;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  stbi__write_context s;
  
  s.buffer[0x30] = '\0';
  s.buffer[0x31] = '\0';
  s.buffer[0x32] = '\0';
  s.buffer[0x33] = '\0';
  s.buffer[0x34] = '\0';
  s.buffer[0x35] = '\0';
  s.buffer[0x36] = '\0';
  s.buffer[0x37] = '\0';
  s.buffer[0x38] = '\0';
  s.buffer[0x39] = '\0';
  s.buffer[0x3a] = '\0';
  s.buffer[0x3b] = '\0';
  s.buffer[0x3c] = '\0';
  s.buffer[0x3d] = '\0';
  s.buffer[0x3e] = '\0';
  s.buffer[0x3f] = '\0';
  s.buffer[0x20] = '\0';
  s.buffer[0x21] = '\0';
  s.buffer[0x22] = '\0';
  s.buffer[0x23] = '\0';
  s.buffer[0x24] = '\0';
  s.buffer[0x25] = '\0';
  s.buffer[0x26] = '\0';
  s.buffer[0x27] = '\0';
  s.buffer[0x28] = '\0';
  s.buffer[0x29] = '\0';
  s.buffer[0x2a] = '\0';
  s.buffer[0x2b] = '\0';
  s.buffer[0x2c] = '\0';
  s.buffer[0x2d] = '\0';
  s.buffer[0x2e] = '\0';
  s.buffer[0x2f] = '\0';
  s.buffer[0x10] = '\0';
  s.buffer[0x11] = '\0';
  s.buffer[0x12] = '\0';
  s.buffer[0x13] = '\0';
  s.buffer[0x14] = '\0';
  s.buffer[0x15] = '\0';
  s.buffer[0x16] = '\0';
  s.buffer[0x17] = '\0';
  s.buffer[0x18] = '\0';
  s.buffer[0x19] = '\0';
  s.buffer[0x1a] = '\0';
  s.buffer[0x1b] = '\0';
  s.buffer[0x1c] = '\0';
  s.buffer[0x1d] = '\0';
  s.buffer[0x1e] = '\0';
  s.buffer[0x1f] = '\0';
  s.buffer[0] = '\0';
  s.buffer[1] = '\0';
  s.buffer[2] = '\0';
  s.buffer[3] = '\0';
  s.buffer[4] = '\0';
  s.buffer[5] = '\0';
  s.buffer[6] = '\0';
  s.buffer[7] = '\0';
  s.buffer[8] = '\0';
  s.buffer[9] = '\0';
  s.buffer[10] = '\0';
  s.buffer[0xb] = '\0';
  s.buffer[0xc] = '\0';
  s.buffer[0xd] = '\0';
  s.buffer[0xe] = '\0';
  s.buffer[0xf] = '\0';
  s.func = (stbi_write_func *)0x0;
  s.context = (void *)0x0;
  s.buf_used = 0;
  s._84_4_ = 0;
  s.context = fopen(filename,"wb");
  s.func = stbi__stdio_write;
  if ((FILE *)s.context == (FILE *)0x0) {
    iVar2 = 0;
  }
  else {
    bVar12 = (comp - 2U & 0xfffffffd) == 0;
    if ((y | x) < 0) {
      iVar2 = 0;
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(&s,(char *)0x0,0,0,(ulong)((int)(comp - (uint)bVar12) < 2 | 10),0,0,0,0,0,
                    (ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)(comp * 8),(ulong)((uint)bVar12 * 8))
      ;
      if (y != 0) {
        iVar2 = comp * x;
        __n = (size_t)comp;
        iVar10 = (y + -1) * iVar2;
        do {
          y = y + -1;
          if (0 < x) {
            iVar5 = 0;
            do {
              __s1 = (void *)((long)data + (long)(iVar5 * comp) + (long)(iVar2 * y));
              expand_mono = (int)__s1;
              if (iVar5 < x + -1) {
                iVar3 = bcmp(__s1,(void *)((long)data +
                                          (long)((iVar5 + 1) * comp) + (long)(iVar2 * y)),__n);
                iVar6 = iVar5 + 2;
                if (iVar3 == 0) {
                  bVar1 = true;
                  uVar9 = 2;
                  if (iVar6 < x) {
                    lVar11 = (long)iVar6;
                    pvVar7 = (void *)((long)data + __n * lVar11 + (long)iVar10);
                    uVar9 = 2;
                    do {
                      lVar11 = lVar11 + 1;
                      iVar3 = bcmp(__s1,pvVar7,__n);
                      if (iVar3 != 0) goto LAB_00119240;
                      uVar8 = (uint)uVar9;
                      uVar4 = uVar8 + 1;
                      if (x <= lVar11) {
                        uVar9 = (ulong)uVar4;
                        goto LAB_00119240;
                      }
                      pvVar7 = (void *)((long)pvVar7 + __n);
                      uVar9 = (ulong)uVar4;
                    } while (uVar8 < 0x7f);
                    uVar9 = (ulong)uVar4;
                  }
                }
                else if (iVar6 < x) {
                  lVar11 = (long)iVar6;
                  pvVar7 = (void *)((long)data + __n * lVar11 + (long)iVar10);
                  uVar9 = 1;
                  do {
                    lVar11 = lVar11 + 1;
                    iVar3 = bcmp(__s1,pvVar7,__n);
                    if (iVar3 == 0) goto LAB_001191a1;
                    iVar3 = (int)uVar9;
                    uVar8 = iVar3 + 1;
                    uVar9 = (ulong)uVar8;
                    if (x <= lVar11) break;
                    __s1 = (void *)((long)__s1 + __n);
                    pvVar7 = (void *)((long)pvVar7 + __n);
                  } while (uVar8 < 0x7f);
                  uVar9 = (ulong)(iVar3 + 2);
LAB_001191a1:
                  bVar1 = false;
                }
                else {
                  uVar9 = 2;
                  bVar1 = false;
                }
              }
              else {
                uVar9 = 1;
                bVar1 = false;
              }
LAB_00119240:
              iVar3 = (int)uVar9;
              if (bVar1) {
                if (0x40 < s.buf_used + 1U) {
                  (*s.func)(s.context,s.buffer,s.buf_used);
                  s._80_8_ = s._80_8_ & 0xffffffff00000000;
                }
                lVar11 = (long)s.buf_used;
                s.buf_used = s.buf_used + 1;
                s.buffer[lVar11] = (char)uVar9 + '\x7f';
                stbiw__write_pixel(&s,comp,(uint)bVar12,0,expand_mono,d);
              }
              else {
                if (0x40 < s.buf_used + 1U) {
                  (*s.func)(s.context,s.buffer,s.buf_used);
                  s._80_8_ = s._80_8_ & 0xffffffff00000000;
                }
                lVar11 = (long)s.buf_used;
                s.buf_used = s.buf_used + 1;
                s.buffer[lVar11] = (char)uVar9 + 0xff;
                if (0 < iVar3) {
                  lVar11 = (long)data + (long)(iVar5 * comp) + (long)iVar10;
                  do {
                    stbiw__write_pixel(&s,comp,(uint)bVar12,0,(int)lVar11,d);
                    lVar11 = lVar11 + __n;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
              }
              iVar5 = iVar3 + iVar5;
            } while (iVar5 < x);
          }
          iVar10 = iVar10 - iVar2;
        } while (y != 0);
      }
      iVar2 = 1;
      if (s.buf_used != 0) {
        (*s.func)(s.context,s.buffer,s.buf_used);
        s._80_8_ = s._80_8_ & 0xffffffff00000000;
      }
    }
    fclose((FILE *)s.context);
  }
  return iVar2;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}